

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashing.h
# Opt level: O0

uint64_t llvm::hashing::detail::hash_16_bytes(uint64_t low,uint64_t high)

{
  ulong uVar1;
  uint64_t b;
  uint64_t a;
  uint64_t kMul;
  uint64_t high_local;
  uint64_t low_local;
  
  uVar1 = (low ^ high) * -0x622015f714c7d297;
  uVar1 = (high ^ uVar1 >> 0x2f ^ uVar1) * -0x622015f714c7d297;
  return (uVar1 >> 0x2f ^ uVar1) * -0x622015f714c7d297;
}

Assistant:

inline uint64_t hash_16_bytes(uint64_t low, uint64_t high) {
  // Murmur-inspired hashing.
  const uint64_t kMul = 0x9ddfea08eb382d69ULL;
  uint64_t a = (low ^ high) * kMul;
  a ^= (a >> 47);
  uint64_t b = (high ^ a) * kMul;
  b ^= (b >> 47);
  b *= kMul;
  return b;
}